

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O0

int __thiscall
andyzip::brotli_decoder::transform_dictionary_word
          (brotli_decoder *this,char *buffer,uint8_t *src,int transform_idx,int copy_len,
          int ringbuffer_mask)

{
  byte bVar1;
  long lVar2;
  char *local_80;
  char *dsrc;
  int i_1;
  byte local_68 [3];
  uint8_t chr;
  int i;
  uint8_t fermented [24];
  char *local_48;
  char *psrc;
  anon_struct_16_3_98baf0e5 *t;
  char *dest;
  int local_28;
  int ringbuffer_mask_local;
  int copy_len_local;
  int transform_idx_local;
  uint8_t *src_local;
  char *buffer_local;
  brotli_decoder *this_local;
  
  lVar2 = (long)transform_idx * 0x10;
  t = (anon_struct_16_3_98baf0e5 *)buffer;
  for (local_48 = &brotli_data::table + lVar2; *local_48 != '\0'; local_48 = local_48 + 1) {
    t->prefix[0] = *local_48;
    t = (anon_struct_16_3_98baf0e5 *)(t->prefix + 1);
  }
  _copy_len_local = src;
  if ((byte)(&DAT_0012ede6)[lVar2] < 0xc) {
    local_28 = copy_len;
    if (2 < (byte)(&DAT_0012ede6)[lVar2]) {
      local_28 = copy_len - ((byte)(&DAT_0012ede6)[lVar2] - 2);
      _copy_len_local = src + (int)((byte)(&DAT_0012ede6)[lVar2] - 2);
    }
  }
  else {
    local_28 = copy_len - ((byte)(&DAT_0012ede6)[lVar2] - 0xb);
  }
  if (((&DAT_0012ede6)[lVar2] == '\x01') || ((&DAT_0012ede6)[lVar2] == '\x02')) {
    if (local_28 < 0x19) {
      memcpy(local_68,_copy_len_local,(long)local_28);
    }
    i_1 = 0;
    do {
      if (local_28 <= i_1) break;
      bVar1 = _copy_len_local[i_1];
      if (bVar1 < 0xc0) {
        if ((0x60 < bVar1) && (bVar1 < 0x7b)) {
          local_68[i_1] = local_68[i_1] ^ 0x20;
        }
        i_1 = i_1 + 1;
      }
      else if (bVar1 < 0xe0) {
        if (i_1 + 1 < local_28) {
          local_68[i_1 + 1] = local_68[i_1 + 1] ^ 0x20;
        }
        i_1 = i_1 + 2;
      }
      else {
        if (i_1 + 2 < local_28) {
          local_68[i_1 + 2] = local_68[i_1 + 2] ^ 0x20;
        }
        i_1 = i_1 + 3;
      }
    } while ((&DAT_0012ede6)[lVar2] != '\x01');
    _copy_len_local = local_68;
  }
  for (dsrc._4_4_ = 0; dsrc._4_4_ != local_28; dsrc._4_4_ = dsrc._4_4_ + 1) {
    t->prefix[0] = *_copy_len_local;
    t = (anon_struct_16_3_98baf0e5 *)(t->prefix + 1);
    _copy_len_local = _copy_len_local + 1;
  }
  for (local_80 = &DAT_0012ede7 + lVar2; *local_80 != '\0'; local_80 = local_80 + 1) {
    t->prefix[0] = *local_80;
    t = (anon_struct_16_3_98baf0e5 *)(t->prefix + 1);
  }
  return (int)t - (int)buffer;
}

Assistant:

int transform_dictionary_word(char *buffer, const uint8_t *src, int transform_idx, int copy_len, int ringbuffer_mask) {
      char *dest = buffer;
      auto &t = brotli_data::table[transform_idx];
      for (const char *psrc = t.prefix; *psrc; ++psrc) {
        *dest++ = *psrc;
      }

      if (t.id >= brotli_data::OmitLast1) {
        copy_len -= t.id - brotli_data::OmitLast1 + 1;
      } else if (t.id >= brotli_data::OmitFirst1) {
        copy_len -= t.id - brotli_data::OmitFirst1 + 1;
        src += t.id - brotli_data::OmitFirst1 + 1;
      }

      // fermentation (aka. case conversion)
      if (t.id == brotli_data::FermentFirst || t.id == brotli_data::FermentAll) {
        uint8_t fermented[24];
        if (copy_len <= 24) {
          memcpy(fermented, src, copy_len);
        }
  
        for (int i = 0; i < copy_len;) {
          uint8_t chr = src[i];
          if (chr < 192) {
            if (chr >= 97 && chr <= 122) {
              fermented[i] ^= 32;
            }
            ++i;
          } else if (chr < 224) {
            if (i + 1 < copy_len) {
              fermented[i+1] ^= 32;
            }
            i += 2;
          } else {
            if (i + 2 < copy_len) {
              fermented[i+2] ^= 32;
            }
            i += 3;
          }
          if (t.id == brotli_data::FermentFirst) break;
        }
        src = fermented;
      }

      for (int i = 0; i != copy_len; ++i) {
        *dest++ = *src++;
      }

      for (const char *dsrc = t.suffix; *dsrc; ++dsrc) {
        *dest++ = *dsrc;
      }

      return (int)(dest - buffer);
    }